

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O1

FRAME_STATS *
accumulate_frame_stats
          (FRAME_STATS *__return_storage_ptr__,FRAME_STATS *mb_stats,int mb_rows,int mb_cols)

{
  long *plVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  int64_t iVar12;
  int64_t iVar13;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  long local_78;
  long local_70;
  int64_t local_68;
  int64_t local_60;
  
  __return_storage_ptr__->neutral_count = 0.0;
  __return_storage_ptr__->intra_skip_count = 0;
  __return_storage_ptr__->image_data_start_row = 0;
  __return_storage_ptr__->sum_mvcs = 0;
  __return_storage_ptr__->intra_factor = 0.0;
  __return_storage_ptr__->sum_mvr_abs = 0;
  __return_storage_ptr__->sum_mvc_abs = 0;
  __return_storage_ptr__->sum_mvrs = 0;
  __return_storage_ptr__->new_mv_count = 0;
  __return_storage_ptr__->sum_in_vectors = 0;
  __return_storage_ptr__->sum_mvr = 0;
  __return_storage_ptr__->sum_mvc = 0;
  __return_storage_ptr__->mv_count = 0;
  __return_storage_ptr__->inter_count = 0;
  *(undefined8 *)&__return_storage_ptr__->second_ref_count = 0;
  __return_storage_ptr__->coded_error = 0;
  __return_storage_ptr__->sr_coded_error = 0;
  __return_storage_ptr__->intra_error = 0;
  __return_storage_ptr__->frame_avg_wavelet_energy = 0;
  __return_storage_ptr__->brightness_factor = 0.0;
  __return_storage_ptr__->image_data_start_row = -1;
  if (mb_rows < 1) {
    local_9c = -1;
    local_70 = 0;
  }
  else {
    iVar12 = __return_storage_ptr__->frame_avg_wavelet_energy;
    iVar13 = __return_storage_ptr__->coded_error;
    dVar8 = __return_storage_ptr__->intra_factor;
    dVar9 = __return_storage_ptr__->brightness_factor;
    local_98 = __return_storage_ptr__->intra_skip_count;
    iVar10 = __return_storage_ptr__->mv_count;
    iVar11 = __return_storage_ptr__->inter_count;
    dVar7 = __return_storage_ptr__->neutral_count;
    local_94 = __return_storage_ptr__->new_mv_count;
    local_90 = __return_storage_ptr__->second_ref_count;
    local_68 = __return_storage_ptr__->sr_coded_error;
    local_8c = __return_storage_ptr__->sum_in_vectors;
    local_88 = __return_storage_ptr__->sum_mvc;
    local_84 = __return_storage_ptr__->sum_mvc_abs;
    local_60 = __return_storage_ptr__->sum_mvcs;
    local_80 = __return_storage_ptr__->sum_mvr;
    local_7c = __return_storage_ptr__->sum_mvr_abs;
    local_78 = __return_storage_ptr__->sum_mvrs;
    pdVar6 = &mb_stats->intra_factor;
    local_9c = -1;
    uVar5 = 0;
    local_70 = 0;
    do {
      if (0 < mb_cols) {
        lVar4 = 0;
        do {
          iVar3 = *(int *)((long)pdVar6 + lVar4 + -0x2c);
          if (iVar3 == -1) {
            iVar3 = local_9c;
          }
          if (local_9c == -1) {
            local_9c = iVar3;
          }
          plVar1 = (long *)((long)pdVar6 + lVar4 + -0x60);
          iVar12 = iVar12 + *plVar1;
          iVar13 = iVar13 + plVar1[1];
          uVar2 = *(undefined8 *)((long)pdVar6 + lVar4 + -0x48);
          iVar10 = iVar10 + (int)uVar2;
          iVar11 = iVar11 + (int)((ulong)uVar2 >> 0x20);
          dVar8 = dVar8 + *(double *)((long)pdVar6 + lVar4);
          dVar9 = dVar9 + ((double *)((long)pdVar6 + lVar4))[1];
          local_70 = local_70 + *(long *)((long)pdVar6 + lVar4 + -0x68);
          local_98 = local_98 + *(int *)((long)pdVar6 + lVar4 + -0x30);
          dVar7 = dVar7 + *(double *)((long)pdVar6 + lVar4 + -0x38);
          local_94 = local_94 + *(int *)((long)pdVar6 + lVar4 + -0x28);
          local_90 = local_90 + *(int *)((long)pdVar6 + lVar4 + -0x40);
          local_68 = local_68 + *(long *)((long)pdVar6 + lVar4 + -0x50);
          local_8c = local_8c + *(int *)((long)pdVar6 + lVar4 + -0x24);
          local_88 = local_88 + *(int *)((long)pdVar6 + lVar4 + -0x1c);
          local_84 = local_84 + *(int *)((long)pdVar6 + lVar4 + -0x14);
          local_60 = local_60 + *(long *)((long)pdVar6 + lVar4 + -8);
          local_80 = local_80 + *(int *)((long)pdVar6 + lVar4 + -0x20);
          local_7c = local_7c + *(int *)((long)pdVar6 + lVar4 + -0x18);
          local_78 = local_78 + *(long *)((long)pdVar6 + lVar4 + -0x10);
          lVar4 = lVar4 + 0x78;
        } while ((ulong)(uint)mb_cols * 0x78 != lVar4);
      }
      uVar5 = uVar5 + 1;
      pdVar6 = pdVar6 + (ulong)(uint)mb_cols * 0xf;
    } while (uVar5 != (uint)mb_rows);
    __return_storage_ptr__->frame_avg_wavelet_energy = iVar12;
    __return_storage_ptr__->coded_error = iVar13;
    __return_storage_ptr__->intra_factor = dVar8;
    __return_storage_ptr__->brightness_factor = dVar9;
    __return_storage_ptr__->intra_skip_count = local_98;
    __return_storage_ptr__->mv_count = iVar10;
    __return_storage_ptr__->inter_count = iVar11;
    __return_storage_ptr__->neutral_count = dVar7;
    __return_storage_ptr__->new_mv_count = local_94;
    __return_storage_ptr__->second_ref_count = local_90;
    __return_storage_ptr__->sr_coded_error = local_68;
    __return_storage_ptr__->sum_in_vectors = local_8c;
    __return_storage_ptr__->sum_mvc = local_88;
    __return_storage_ptr__->sum_mvc_abs = local_84;
    __return_storage_ptr__->sum_mvcs = local_60;
    __return_storage_ptr__->sum_mvr = local_80;
    __return_storage_ptr__->sum_mvr_abs = local_7c;
    __return_storage_ptr__->sum_mvrs = local_78;
  }
  __return_storage_ptr__->image_data_start_row = local_9c;
  __return_storage_ptr__->intra_error = local_70;
  return __return_storage_ptr__;
}

Assistant:

static FRAME_STATS accumulate_frame_stats(FRAME_STATS *mb_stats, int mb_rows,
                                          int mb_cols) {
  FRAME_STATS stats = { 0 };
  int i, j;

  stats.image_data_start_row = INVALID_ROW;
  for (j = 0; j < mb_rows; j++) {
    for (i = 0; i < mb_cols; i++) {
      FRAME_STATS mb_stat = mb_stats[j * mb_cols + i];
      stats.brightness_factor += mb_stat.brightness_factor;
      stats.coded_error += mb_stat.coded_error;
      stats.frame_avg_wavelet_energy += mb_stat.frame_avg_wavelet_energy;
      if (stats.image_data_start_row == INVALID_ROW &&
          mb_stat.image_data_start_row != INVALID_ROW) {
        stats.image_data_start_row = mb_stat.image_data_start_row;
      }
      stats.inter_count += mb_stat.inter_count;
      stats.intra_error += mb_stat.intra_error;
      stats.intra_factor += mb_stat.intra_factor;
      stats.intra_skip_count += mb_stat.intra_skip_count;
      stats.mv_count += mb_stat.mv_count;
      stats.neutral_count += mb_stat.neutral_count;
      stats.new_mv_count += mb_stat.new_mv_count;
      stats.second_ref_count += mb_stat.second_ref_count;
      stats.sr_coded_error += mb_stat.sr_coded_error;
      stats.sum_in_vectors += mb_stat.sum_in_vectors;
      stats.sum_mvc += mb_stat.sum_mvc;
      stats.sum_mvc_abs += mb_stat.sum_mvc_abs;
      stats.sum_mvcs += mb_stat.sum_mvcs;
      stats.sum_mvr += mb_stat.sum_mvr;
      stats.sum_mvr_abs += mb_stat.sum_mvr_abs;
      stats.sum_mvrs += mb_stat.sum_mvrs;
    }
  }
  return stats;
}